

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O3

int __thiscall VpuApiLegacy::init(VpuApiLegacy *this,EVP_PKEY_CTX *ctx)

{
  MppBufferGroup *ppvVar1;
  MppPacket *ppvVar2;
  MppCodingType coding;
  MppCtx pvVar3;
  VpuApiMlvecStaticCfg *cfg;
  ulong uVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  RK_S32 RVar10;
  RK_S32 RVar11;
  RK_S32 RVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  RK_S32 RVar15;
  RK_S32 RVar16;
  undefined4 uVar17;
  MPP_RET MVar18;
  int iVar19;
  uint uVar20;
  RK_U32 RVar21;
  MppFrameFormat MVar22;
  undefined4 uVar23;
  void *pvVar24;
  undefined8 uVar25;
  long in_RDX;
  MppParam pvVar26;
  char *pcVar27;
  uint uVar28;
  bool bVar29;
  MppEncSeiMode sei_mode;
  MppPollType block;
  undefined4 local_44;
  MppPacket local_40;
  MppApi *local_38;
  
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","init");
  }
  pvVar3 = this->mpp_ctx;
  if ((pvVar3 == (MppCtx)0x0) || (this->mpi == (MppApi *)0x0)) {
    _mpp_log_l(2,"vpu_api_legacy","found invalid context input",0);
    return -3;
  }
  if (*(int *)(ctx + 8) == 1) {
    uVar28 = 0;
    MVar18 = mpp_init(pvVar3,0,*(undefined4 *)(ctx + 0xc));
    if (MVar18 != MPP_OK) goto LAB_00105e94;
    (this->vpug).CodecType = *(RK_U32 *)(ctx + 8);
    uVar4 = *(ulong *)(ctx + 0x10);
    (this->vpug).ImgWidth = (int)uVar4;
    (this->vpug).ImgHeight = (int)(uVar4 >> 0x20);
    if (*(uint **)(ctx + 0x88) != (uint *)0x0) {
      uVar28 = **(uint **)(ctx + 0x88);
    }
    pvVar3 = this->mpp_ctx;
    local_38 = this->mpi;
    pvVar26 = this->frm_info;
    iVar19 = *(int *)(ctx + 0x44);
    uVar20 = (uint)uVar4;
    if (*(int *)(ctx + 0x40) == 10) {
      RVar21 = (uint)(iVar19 == 1) * 2 + 1;
    }
    else {
      if ((*(int *)(ctx + 0x40) == 0) && (iVar19 == 0)) {
        if ((int)uVar20 < 0) {
          RVar21 = ((uint)(uVar4 >> 0x1d) & 2) + 1;
          goto LAB_00105fac;
        }
        bVar29 = 0x3fffffff < uVar20;
      }
      else {
        bVar29 = iVar19 == 1;
      }
      RVar21 = (uint)bVar29 * 2;
    }
LAB_00105fac:
    (this->vpug).CodecType = RVar21;
    (this->vpug).ImgWidth = uVar20 & 0xffff;
    mpp_frame_set_width(pvVar26);
    mpp_frame_set_height(pvVar26,(this->vpug).ImgHeight);
    mpp_frame_set_fmt(pvVar26,uVar28 | (this->vpug).CodecType);
    (*local_38->control)(pvVar3,MPP_DEC_SET_FRAME_INFO,pvVar26);
    RVar21 = mpp_frame_get_hor_stride(pvVar26);
    (this->vpug).ImgHorStride = RVar21;
    RVar21 = mpp_frame_get_ver_stride(pvVar26);
    (this->vpug).ImgVerStride = RVar21;
    RVar21 = mpp_frame_get_buf_size(pvVar26);
    (this->vpug).BufSize = RVar21;
    if (in_RDX != 0) {
      local_40 = (MppPacket)0x0;
      mpp_packet_init(&local_40);
      mpp_packet_set_extra_data(local_40);
      (*this->mpi->decode_put_packet)(this->mpp_ctx,local_40);
      mpp_packet_deinit(&local_40);
    }
    local_40 = (MppPacket)((ulong)local_40 & 0xffffffff00000000);
    MVar18 = (*this->mpi->control)(this->mpp_ctx,MPP_DEC_SET_ENABLE_DEINTERLACE,&local_40);
    if (MVar18 != MPP_OK) {
      _mpp_log_l(2,"vpu_api_legacy","disable mpp deinterlace failed ret %d\n","init",MVar18);
    }
  }
  else {
    if (*(int *)(ctx + 8) != 2) {
      _mpp_log_l(2,"vpu_api_legacy","found invalid codec type %d\n",0);
      return -0x3eb;
    }
    MVar18 = mpp_init(pvVar3,1,*(undefined4 *)(ctx + 0xc));
    if (MVar18 != MPP_OK) {
LAB_00105e94:
      pcVar27 = " init error. \n";
      uVar25 = 2;
      goto LAB_00105eb1;
    }
    cfg = *(VpuApiMlvecStaticCfg **)(ctx + 0x88);
    coding = *(MppCodingType *)(ctx + 0xc);
    local_40 = (MppPacket)CONCAT44(local_40._4_4_,100);
    local_44 = 0;
    MVar18 = (*this->mpi->control)(this->mpp_ctx,MPP_SET_INPUT_TIMEOUT,&local_40);
    if (MVar18 != MPP_OK) {
      _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_SET_INPUT_TIMEOUT failed\n",0);
    }
    MVar18 = (*this->mpi->control)(this->mpp_ctx,MPP_ENC_SET_SEI_CFG,&local_44);
    if (MVar18 != MPP_OK) {
      _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n",0,MVar18);
    }
    ppvVar1 = &this->memGroup;
    if ((this->memGroup == (MppBufferGroup)0x0) &&
       (iVar19 = mpp_buffer_group_get(ppvVar1,1,0,"vpu_api_legacy","init"), iVar19 != 0)) {
      _mpp_log_l(2,"vpu_api_legacy","memGroup mpp_buffer_group_get failed %d\n",0,iVar19);
      return iVar19;
    }
    iVar19 = mpp_enc_cfg_init(&this->enc_cfg);
    if (iVar19 != 0) {
      _mpp_log_l(2,"vpu_api_legacy","mpp_enc_cfg_init failed %d\n",0,iVar19);
      mpp_buffer_group_put(*ppvVar1);
      *ppvVar1 = (MppBufferGroup)0x0;
      return iVar19;
    }
    MVar22 = vpu_pic_type_remap_to_mpp(cfg->format);
    this->format = MVar22;
    uVar25._0_2_ = cfg->width;
    uVar25._2_2_ = cfg->sar_width;
    uVar25._4_2_ = cfg->height;
    uVar25._6_2_ = cfg->sar_height;
    RVar5 = cfg->rc_mode;
    RVar6 = cfg->bitRate;
    RVar7 = cfg->framerate;
    RVar8 = cfg->qp;
    RVar9 = cfg->enableCabac;
    RVar10 = cfg->cabacInitIdc;
    RVar11 = cfg->format;
    RVar12 = cfg->intraPicRate;
    RVar13 = cfg->framerateout;
    RVar14 = cfg->profileIdc;
    RVar15 = cfg->levelIdc;
    RVar16 = cfg->magic;
    uVar23 = *(undefined4 *)&cfg->field_0x38;
    uVar17 = *(undefined4 *)&cfg->field_0x3c;
    (this->enc_param).width = (int)uVar25;
    (this->enc_param).height = (int)((ulong)uVar25 >> 0x20);
    (this->enc_param).rc_mode = RVar5;
    (this->enc_param).bitRate = RVar6;
    (this->enc_param).framerate = RVar7;
    (this->enc_param).qp = RVar8;
    (this->enc_param).enableCabac = RVar9;
    (this->enc_param).cabacInitIdc = RVar10;
    (this->enc_param).format = RVar11;
    (this->enc_param).intraPicRate = RVar12;
    (this->enc_param).framerateout = RVar13;
    (this->enc_param).profileIdc = RVar14;
    (this->enc_param).levelIdc = RVar15;
    (this->enc_param).reserved[0] = RVar16;
    (this->enc_param).reserved[1] = uVar23;
    (this->enc_param).reserved[2] = uVar17;
    MVar18 = vpu_api_mlvec_check_cfg(cfg);
    if ((MVar18 == MPP_OK) && (this->mlvec == (VpuApiMlvec)0x0)) {
      vpu_api_mlvec_init(&this->mlvec);
      vpu_api_mlvec_setup(this->mlvec,this->mpp_ctx,this->mpi,this->enc_cfg);
    }
    if (this->mlvec != (VpuApiMlvec)0x0) {
      vpu_api_mlvec_set_st_cfg(this->mlvec,cfg);
    }
    vpu_api_set_enc_cfg(this->mpp_ctx,this->mpi,this->enc_cfg,coding,this->format,
                        (EncParameter_t *)cfg);
    MVar18 = MPP_OK;
    if (this->mlvec != (VpuApiMlvec)0x0) goto LAB_00106245;
    pvVar26 = this->enc_hdr_pkt;
    if (pvVar26 == (MppParam)0x0) {
      ppvVar2 = &this->enc_hdr_pkt;
      pvVar24 = this->enc_hdr_buf;
      if (pvVar24 == (void *)0x0) {
        this->enc_hdr_buf_size = 0x400;
        pvVar24 = (void *)mpp_osal_calloc("init",0x400);
        this->enc_hdr_buf = pvVar24;
        if (pvVar24 != (void *)0x0) goto LAB_001061ac;
      }
      else {
LAB_001061ac:
        mpp_packet_init(ppvVar2,pvVar24,(long)this->enc_hdr_buf_size);
      }
      pvVar26 = *ppvVar2;
      if (pvVar26 == (MppParam)0x0) {
        MVar18 = MPP_OK;
        _mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"enc_hdr_pkt","init",0x1e0)
        ;
        if ((DAT_0011234b & 0x10) != 0) {
          abort();
        }
        pvVar26 = *ppvVar2;
        if (pvVar26 == (MppParam)0x0) goto LAB_00106245;
      }
    }
    MVar18 = (*this->mpi->control)(this->mpp_ctx,MPP_ENC_GET_HDR_SYNC,pvVar26);
    uVar23 = mpp_packet_get_length(this->enc_hdr_pkt);
    *(undefined4 *)(ctx + 0x20) = uVar23;
    uVar25 = mpp_packet_get_data(this->enc_hdr_pkt);
    *(undefined8 *)(ctx + 0x18) = uVar25;
  }
LAB_00106245:
  this->init_ok = 1;
  if (((byte)vpu_api_debug & 1) == 0) {
    return MVar18;
  }
  pcVar27 = "leave\n";
  uVar25 = 4;
LAB_00105eb1:
  _mpp_log_l(uVar25,"vpu_api_legacy",pcVar27,"init");
  return MVar18;
}

Assistant:

RK_S32 VpuApiLegacy::init(VpuCodecContext *ctx, RK_U8 *extraData, RK_U32 extra_size)
{
    vpu_api_dbg_func("enter\n");

    MPP_RET ret = MPP_OK;
    MppCtxType type;

    if (mpp_ctx == NULL || mpi == NULL) {
        mpp_err("found invalid context input");
        return MPP_ERR_NULL_PTR;
    }

    if (CODEC_DECODER == ctx->codecType) {
        type = MPP_CTX_DEC;
    } else if (CODEC_ENCODER == ctx->codecType) {
        type = MPP_CTX_ENC;
    } else {
        mpp_err("found invalid codec type %d\n", ctx->codecType);
        return MPP_ERR_VPU_CODEC_INIT;
    }

    ret = mpp_init(mpp_ctx, type, (MppCodingType)ctx->videoCoding);
    if (ret) {
        mpp_err_f(" init error. \n");
        return ret;
    }

    if (MPP_CTX_ENC == type) {
        EncParameter_t *param = (EncParameter_t*)ctx->private_data;
        MppCodingType coding = (MppCodingType)ctx->videoCoding;
        MppPollType block = (MppPollType)VPU_API_ENC_INPUT_TIMEOUT;
        MppEncSeiMode sei_mode = MPP_ENC_SEI_MODE_DISABLE;

        /* setup input / output block mode */
        ret = mpi->control(mpp_ctx, MPP_SET_INPUT_TIMEOUT, (MppParam)&block);
        if (MPP_OK != ret)
            mpp_err("mpi control MPP_SET_INPUT_TIMEOUT failed\n");

        /* disable sei by default */
        ret = mpi->control(mpp_ctx, MPP_ENC_SET_SEI_CFG, &sei_mode);
        if (ret)
            mpp_err("mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n", ret);

        if (memGroup == NULL) {
            ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err("memGroup mpp_buffer_group_get failed %d\n", ret);
                return ret;
            }
        }

        ret = mpp_enc_cfg_init(&enc_cfg);
        if (ret) {
            mpp_err("mpp_enc_cfg_init failed %d\n", ret);
            mpp_buffer_group_put(memGroup);
            memGroup = NULL;
            return ret;
        }

        format = vpu_pic_type_remap_to_mpp((EncInputPictureType)param->format);

        memcpy(&enc_param, param, sizeof(enc_param));

        if (MPP_OK == vpu_api_mlvec_check_cfg(param)) {
            if (NULL == mlvec) {
                vpu_api_mlvec_init(&mlvec);
                vpu_api_mlvec_setup(mlvec, mpp_ctx, mpi, enc_cfg);
            }
        }

        if (mlvec)
            vpu_api_mlvec_set_st_cfg(mlvec, (VpuApiMlvecStaticCfg *)param);

        vpu_api_set_enc_cfg(mpp_ctx, mpi, enc_cfg, coding, format, param);

        if (!mlvec) {
            if (NULL == enc_hdr_pkt) {
                if (NULL == enc_hdr_buf) {
                    enc_hdr_buf_size = SZ_1K;
                    enc_hdr_buf = mpp_calloc_size(RK_U8, enc_hdr_buf_size);
                }

                if (enc_hdr_buf)
                    mpp_packet_init(&enc_hdr_pkt, enc_hdr_buf, enc_hdr_buf_size);
            }

            mpp_assert(enc_hdr_pkt);
            if (enc_hdr_pkt) {
                ret = mpi->control(mpp_ctx, MPP_ENC_GET_HDR_SYNC, enc_hdr_pkt);
                ctx->extradata_size = mpp_packet_get_length(enc_hdr_pkt);
                ctx->extradata      = mpp_packet_get_data(enc_hdr_pkt);
            }
        }
    } else { /* MPP_CTX_DEC */
        vpug.CodecType  = ctx->codecType;
        vpug.ImgWidth   = ctx->width;
        vpug.ImgHeight  = ctx->height;

        init_frame_info(ctx, mpp_ctx, mpi, frm_info, &vpug);

        if (extraData != NULL) {
            MppPacket pkt = NULL;

            mpp_packet_init(&pkt, extraData, extra_size);
            mpp_packet_set_extra_data(pkt);
            mpi->decode_put_packet(mpp_ctx, pkt);
            mpp_packet_deinit(&pkt);
        }

        RK_U32 flag = 0;
        ret = mpi->control(mpp_ctx, MPP_DEC_SET_ENABLE_DEINTERLACE, &flag);
        if (ret)
            mpp_err_f("disable mpp deinterlace failed ret %d\n", ret);
    }

    init_ok = 1;

    vpu_api_dbg_func("leave\n");
    return ret;
}